

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_search.c
# Opt level: O3

void av1_rd_use_partition
               (AV1_COMP *cpi,ThreadData_conflict *td,TileDataEnc *tile_data,MB_MODE_INFO **mib,
               TokenExtra **tp,int mi_row,int mi_col,BLOCK_SIZE bsize,int *rate,int64_t *dist,
               int do_recon,PC_TREE *pc_tree)

{
  uint8_t uVar1;
  byte bVar2;
  BLOCK_SIZE BVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  MB_MODE_INFO **ppMVar7;
  byte bVar8;
  RD_STATS best_rd;
  RD_STATS best_rd_00;
  RD_STATS best_rd_01;
  RD_STATS best_rd_02;
  RD_STATS best_rd_03;
  RD_STATS best_rd_04;
  RD_STATS best_rd_05;
  int iVar9;
  int64_t iVar10;
  byte bVar11;
  BLOCK_SIZE BVar12;
  int iVar13;
  ulong uVar14;
  PICK_MODE_CONTEXT *pPVar15;
  PC_TREE *pPVar16;
  long lVar17;
  uint uVar18;
  int mi_col_00;
  long lVar19;
  int iVar20;
  int iVar21;
  long lVar22;
  int i;
  TokenExtra **tp_00;
  bool bVar23;
  int i_1;
  bool bVar24;
  RD_STATS invalid_rdc;
  RD_STATS none_rdc;
  RD_STATS tmp_rdc;
  RD_SEARCH_MACROBLOCK_CONTEXT x_ctx;
  undefined4 uVar26;
  int *piVar25;
  int64_t *in_stack_fffffffffffffd20;
  RD_STATS local_260;
  ulong local_238;
  TokenExtra **local_230;
  long local_228;
  int64_t *local_220;
  undefined8 uStack_218;
  undefined8 local_210;
  undefined8 uStack_208;
  undefined1 local_200;
  undefined7 uStack_1ff;
  ModeCosts *local_1f8;
  int local_1ec;
  RD_STATS local_1e8;
  RD_STATS local_1c0;
  long local_198;
  PC_TREE_SHARED_BUFFERS *local_190;
  int (*local_188) [10];
  RD_SEARCH_MACROBLOCK_CONTEXT local_180;
  
  uVar14 = (ulong)bsize;
  uVar1 = ((cpi->common).seq_params)->monochrome;
  bVar2 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[uVar14];
  bVar8 = bVar2 >> 1;
  if (uVar14 < 3) {
    bVar11 = 0;
    local_228 = 0;
LAB_001e682d:
    BVar12 = BLOCK_INVALID;
    switch(uVar14) {
    case 0:
      break;
    case 1:
    case 2:
    case 4:
    case 5:
    case 7:
    case 8:
      goto switchD_001e6848_caseD_1;
    case 3:
      uVar14 = 1;
      break;
    case 6:
      uVar14 = 2;
      break;
    case 9:
      uVar14 = 3;
      break;
    default:
      if (bsize == BLOCK_64X64) {
        uVar14 = 4;
      }
      else {
        if (bsize != BLOCK_128X128) goto switchD_001e6848_caseD_1;
        uVar14 = 5;
      }
    }
    BVar12 = subsize_lookup[bVar11][uVar14];
  }
  else {
    lVar22 = (ulong)""[uVar14] - 1;
    local_228 = (ulong)((uint)(((uint)(int)(td->mb).e_mbd.above_partition_context[mi_col] >>
                                ((uint)lVar22 & 0x1f) & 1) != 0) +
                       ((uint)(int)(td->mb).e_mbd.left_partition_context[mi_row & 0x1f] >>
                        ((byte)lVar22 & 0x1f) & 1) * 2) + (ulong)""[uVar14] * 4 + -4;
    iVar20 = (cpi->common).mi_params.mi_rows;
    bVar11 = 0xff;
    if ((mi_row < iVar20) && (iVar13 = (cpi->common).mi_params.mi_cols, mi_col < iVar13)) {
      iVar21 = (cpi->common).mi_params.mi_stride;
      ppMVar7 = (cpi->common).mi_params.mi_grid_base;
      lVar22 = (long)(iVar21 * mi_row + mi_col);
      BVar12 = ppMVar7[lVar22]->bsize;
      if (BVar12 == bsize) {
        bVar11 = 0;
      }
      else {
        bVar4 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[uVar14]
        ;
        bVar5 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[BVar12]
        ;
        bVar6 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[BVar12]
        ;
        if ((bsize != BLOCK_8X8) && ((int)((uint)bVar8 + mi_row) < iVar20)) {
          if ((int)(mi_col + (uint)(bVar4 >> 1)) < iVar13) {
            if (bVar6 == bVar2) {
              bVar11 = 8;
              if ((uint)bVar5 << 2 != (uint)bVar4) {
                bVar11 = (ppMVar7[lVar22 + (int)((uint)(bVar4 >> 1) * iVar21)]->bsize != BVar12) *
                         '\x04' + 1;
              }
            }
            else if (bVar5 == bVar4) {
              bVar11 = 9;
              local_238._0_4_ = (uint)bVar2;
              if ((uint)bVar6 << 2 != (uint)local_238) {
                bVar11 = (ppMVar7[lVar22 + (ulong)bVar8]->bsize != BVar12) * '\x05' + 2;
              }
            }
            else {
              bVar11 = 3;
              if (((uint)bVar5 * 2 == (uint)bVar4 && (uint)bVar6 * 2 == (uint)bVar2) &&
                 (bVar11 = 4,
                 "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                 [ppMVar7[lVar22 + (int)((uint)(bVar4 >> 1) * iVar21)]->bsize] != bVar2)) {
                bVar11 = ("\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                          [ppMVar7[lVar22 + (ulong)bVar8]->bsize] == bVar4) * '\x03' + 3;
              }
            }
            goto LAB_001e682d;
          }
        }
        lVar22 = (ulong)(bVar5 < bVar4) + (ulong)(bVar6 < bVar2) * 2;
        if (lVar22 == 0) goto LAB_001e6875;
        bVar11 = *(byte *)((long)&get_partition_base_partitions + lVar22);
      }
      goto LAB_001e682d;
    }
LAB_001e6875:
    BVar12 = BLOCK_INVALID;
  }
switchD_001e6848_caseD_1:
  BVar3 = (*mib)->bsize;
  (td->mb).try_merge_partition = 0;
  pPVar15 = pc_tree->none;
  local_238 = (ulong)bVar2;
  local_230 = tp;
  if (pPVar15 == (PICK_MODE_CONTEXT *)0x0) {
    pPVar15 = av1_alloc_pmc(cpi,bsize,&td->shared_coeff_buf);
    pc_tree->none = pPVar15;
    if (pPVar15 == (PICK_MODE_CONTEXT *)0x0) {
      aom_internal_error((td->mb).e_mbd.error_info,AOM_CODEC_MEM_ERROR,
                         "Failed to allocate PICK_MODE_CONTEXT");
      pPVar15 = pc_tree->none;
    }
  }
  if ((cpi->common).mi_params.mi_rows <= mi_row) {
    return;
  }
  if ((cpi->common).mi_params.mi_cols <= mi_col) {
    return;
  }
  iVar20 = (uint)(uVar1 == '\0') * 2 + 1;
  local_260.rate = 0x7fffffff;
  local_260.zero_rate = 0;
  local_260.dist = 0x7fffffffffffffff;
  local_260.rdcost = 0x7fffffffffffffff;
  local_260.sse = 0x7fffffffffffffff;
  local_260.skip_txfm = '\0';
  local_1e8.rate = 0x7fffffff;
  local_1e8.dist = 0x7fffffffffffffff;
  local_1e8.rdcost = 0x7fffffffffffffff;
  local_1e8.sse = 0x7fffffffffffffff;
  local_1e8.skip_txfm = '\0';
  local_1e8.zero_rate = 0;
  local_220 = (int64_t *)0x7fffffff;
  uStack_218 = 0x7fffffffffffffff;
  local_210 = 0x7fffffffffffffff;
  uStack_208 = 0x7fffffffffffffff;
  local_200 = 0;
  pc_tree->partitioning = bVar11;
  (td->mb).e_mbd.above_txfm_context =
       (cpi->common).above_contexts.txfm[(tile_data->tile_info).tile_row] + mi_col;
  (td->mb).e_mbd.left_txfm_context = (td->mb).e_mbd.left_txfm_context_buffer + (mi_row & 0x1f);
  av1_save_context(&td->mb,&local_180,mi_row,mi_col,bsize,iVar20);
  if ((bsize == BLOCK_16X16) && (cpi->vaq_refresh != 0)) {
    av1_set_offsets(cpi,&tile_data->tile_info,&td->mb,mi_row,mi_col,BLOCK_16X16);
    iVar13 = av1_log_block_var(cpi,&td->mb,BLOCK_16X16);
    (td->mb).mb_energy = iVar13;
  }
  local_1f8 = &(td->mb).mode_costs;
  local_1ec = (td->mb).rdmult;
  uVar26 = 0;
  setup_block_rdmult(cpi,&td->mb,mi_row,mi_col,bsize,'\0',(MB_MODE_INFO *)0x0);
  bVar24 = true;
  if (((bVar11 != 0) && ((cpi->sf).part_sf.partition_search_type == '\x02')) &&
     (iVar13 = (cpi->sf).part_sf.adjust_var_based_rd_partitioning, iVar13 < 3 && iVar13 != 0)) {
    if (bsize < BLOCK_32X64) {
LAB_001e6b2d:
      if (((int)(mi_row + (uint)bVar8) < (cpi->common).mi_params.mi_rows) &&
         ((int)((uint)bVar8 + mi_col) < (cpi->common).mi_params.mi_cols)) {
        (*mib)->bsize = bsize;
        pc_tree->partitioning = '\0';
        (td->mb).try_merge_partition = 1;
        best_rd._33_7_ = uStack_1ff;
        best_rd.skip_txfm = local_200;
        best_rd.dist._0_4_ = (int)uStack_218;
        best_rd._0_8_ = local_220;
        best_rd.dist._4_4_ = (int)((ulong)uStack_218 >> 0x20);
        best_rd.rdcost = local_210;
        best_rd.sse = uStack_208;
        in_stack_fffffffffffffd20 = local_220;
        pick_sb_modes(cpi,tile_data,&td->mb,mi_row,mi_col,&local_1e8,'\0',bsize,pPVar15,best_rd);
        bVar24 = true;
        if ((long)local_1e8.rate != 0x7fffffff) {
          lVar22 = (long)local_1f8->partition_cost[local_228][0] + (long)local_1e8.rate;
          local_1e8.rate = (int)lVar22;
          local_1e8.rdcost = local_1e8.dist * 0x80 + ((td->mb).rdmult * lVar22 + 0x100 >> 9);
          bVar24 = local_1e8.rate == 0x7fffffff;
        }
        bVar24 = (bool)(local_1e8.skip_txfm != '\x01' | bVar24);
        av1_restore_context(&td->mb,&local_180,mi_row,mi_col,bsize,iVar20);
        (*mib)->bsize = BVar3;
        pc_tree->partitioning = bVar11;
      }
    }
    else if (iVar13 == 2) {
      iVar13 = (cpi->common).width;
      iVar21 = (cpi->common).height;
      if (iVar13 < iVar21) {
        iVar21 = iVar13;
      }
      if (((bsize == BLOCK_64X64) && (0x167 < iVar21)) &&
         (0xbe < (cpi->common).quant_params.base_qindex)) goto LAB_001e6b2d;
    }
  }
  lVar22 = 0;
  do {
    pPVar16 = av1_alloc_pc_tree_node(BVar12);
    pc_tree->split[lVar22] = pPVar16;
    if (pPVar16 == (PC_TREE *)0x0) {
      aom_internal_error((td->mb).e_mbd.error_info,AOM_CODEC_MEM_ERROR,"Failed to allocate PC_TREE")
      ;
      pPVar16 = pc_tree->split[lVar22];
    }
    tp_00 = local_230;
    pPVar16->index = (int)lVar22;
    lVar22 = lVar22 + 1;
  } while (lVar22 != 4);
  if (bVar11 < 4) {
    switch((ulong)bVar11) {
    case 0:
      best_rd_00._33_7_ = uStack_1ff;
      best_rd_00.skip_txfm = local_200;
      best_rd_00.dist._0_4_ = (int)uStack_218;
      best_rd_00._0_8_ = local_220;
      best_rd_00.dist._4_4_ = (int)((ulong)uStack_218 >> 0x20);
      best_rd_00.rdcost = local_210;
      best_rd_00.sse = uStack_208;
      in_stack_fffffffffffffd20 = local_220;
      pick_sb_modes(cpi,tile_data,&td->mb,mi_row,mi_col,&local_260,'\0',bsize,pPVar15,best_rd_00);
      break;
    case 1:
      if (bVar24) {
        lVar22 = 0;
        bVar24 = true;
        do {
          bVar23 = bVar24;
          pPVar15 = av1_alloc_pmc(cpi,BVar12,&td->shared_coeff_buf);
          pc_tree->horizontal[lVar22] = pPVar15;
          if (pPVar15 == (PICK_MODE_CONTEXT *)0x0) {
            aom_internal_error((td->mb).e_mbd.error_info,AOM_CODEC_MEM_ERROR,
                               "Failed to allocate PICK_MODE_CONTEXT");
          }
          lVar22 = 1;
          bVar24 = false;
        } while (bVar23);
        best_rd_03._33_7_ = uStack_1ff;
        best_rd_03.skip_txfm = local_200;
        best_rd_03.dist._0_4_ = (int)uStack_218;
        best_rd_03._0_8_ = local_220;
        best_rd_03.dist._4_4_ = (int)((ulong)uStack_218 >> 0x20);
        best_rd_03.rdcost = local_210;
        best_rd_03.sse = uStack_208;
        in_stack_fffffffffffffd20 = local_220;
        pick_sb_modes(cpi,tile_data,&td->mb,mi_row,mi_col,&local_260,'\x01',BVar12,
                      pc_tree->horizontal[0],best_rd_03);
        tp_00 = local_230;
        if (bsize < BLOCK_8X8 || local_260.rate == 0x7fffffff) goto LAB_001e7515;
        iVar13 = (uint)bVar8 + mi_row;
        if (iVar13 < (cpi->common).mi_params.mi_rows) {
          local_1c0.rate = 0;
          local_1c0.zero_rate = 0;
          local_1c0.dist = 0;
          local_1c0.rdcost = 0;
          local_1c0.sse = 0;
          local_1c0.skip_txfm = '\x01';
          piVar25 = (int *)CONCAT44(uVar26,1);
          av1_update_state(cpi,td,pc_tree->horizontal[0],mi_row,mi_col,BVar12,'\x01');
          encode_superblock(cpi,tile_data,td,local_230,'\x01',BVar12,piVar25);
          best_rd_04._33_7_ = uStack_1ff;
          best_rd_04.skip_txfm = local_200;
          best_rd_04.dist._0_4_ = (int)uStack_218;
          best_rd_04._0_8_ = local_220;
          best_rd_04.dist._4_4_ = (int)((ulong)uStack_218 >> 0x20);
          best_rd_04.rdcost = local_210;
          best_rd_04.sse = uStack_208;
          in_stack_fffffffffffffd20 = local_220;
          pick_sb_modes(cpi,tile_data,&td->mb,iVar13,mi_col,&local_1c0,'\x01',BVar12,
                        pc_tree->horizontal[1],best_rd_04);
          if (local_1c0.dist == 0x7fffffffffffffff || local_1c0.rate == 0x7fffffff) {
            local_260.sse = 0x7fffffffffffffff;
            local_260.skip_txfm = '\0';
            local_260.rate = 0;
            local_260.zero_rate = 0;
            iVar13 = 0x7fffffff;
            local_260.dist = 0x7fffffffffffffff;
            local_260.rdcost = 0x7fffffffffffffff;
          }
          else {
            iVar13 = local_1c0.rate + local_260.rate;
            local_260.dist = local_1c0.dist + local_260.dist;
            local_260.rdcost = local_260.rdcost + local_1c0.rdcost;
          }
          local_260.rate = iVar13;
          tp_00 = local_230;
        }
      }
      else {
LAB_001e74d3:
        local_260.rate = 0x7fffffff;
        local_260.zero_rate = 0;
        local_260.dist = 0x7fffffffffffffff;
        local_260.rdcost = 0x7fffffffffffffff;
        local_260.sse = 0x7fffffffffffffff;
        local_260.skip_txfm = '\0';
      }
      break;
    case 2:
      if (!bVar24) goto LAB_001e74d3;
      lVar22 = 0;
      bVar24 = true;
      do {
        bVar23 = bVar24;
        pPVar15 = av1_alloc_pmc(cpi,BVar12,&td->shared_coeff_buf);
        pc_tree->vertical[lVar22] = pPVar15;
        if (pPVar15 == (PICK_MODE_CONTEXT *)0x0) {
          aom_internal_error((td->mb).e_mbd.error_info,AOM_CODEC_MEM_ERROR,
                             "Failed to allocate PICK_MODE_CONTEXT");
        }
        lVar22 = 1;
        bVar24 = false;
      } while (bVar23);
      best_rd_01._33_7_ = uStack_1ff;
      best_rd_01.skip_txfm = local_200;
      best_rd_01.dist._0_4_ = (int)uStack_218;
      best_rd_01._0_8_ = local_220;
      best_rd_01.dist._4_4_ = (int)((ulong)uStack_218 >> 0x20);
      best_rd_01.rdcost = local_210;
      best_rd_01.sse = uStack_208;
      in_stack_fffffffffffffd20 = local_220;
      pick_sb_modes(cpi,tile_data,&td->mb,mi_row,mi_col,&local_260,'\x02',BVar12,
                    pc_tree->vertical[0],best_rd_01);
      tp_00 = local_230;
      if (bsize < BLOCK_8X8 || local_260.rate == 0x7fffffff) goto LAB_001e7515;
      iVar13 = (uint)bVar8 + mi_col;
      if (iVar13 < (cpi->common).mi_params.mi_cols) {
        local_1c0.rate = 0;
        local_1c0.zero_rate = 0;
        local_1c0.dist = 0;
        local_1c0.rdcost = 0;
        local_1c0.sse = 0;
        local_1c0.skip_txfm = '\x01';
        piVar25 = (int *)CONCAT44(uVar26,1);
        av1_update_state(cpi,td,pc_tree->vertical[0],mi_row,mi_col,BVar12,'\x01');
        encode_superblock(cpi,tile_data,td,tp_00,'\x01',BVar12,piVar25);
        best_rd_02._33_7_ = uStack_1ff;
        best_rd_02.skip_txfm = local_200;
        best_rd_02.dist._0_4_ = (int)uStack_218;
        best_rd_02._0_8_ = local_220;
        best_rd_02.dist._4_4_ = (int)((ulong)uStack_218 >> 0x20);
        best_rd_02.rdcost = local_210;
        best_rd_02.sse = uStack_208;
        in_stack_fffffffffffffd20 = local_220;
        pick_sb_modes(cpi,tile_data,&td->mb,mi_row,iVar13,&local_1c0,'\x02',BVar12,
                      pc_tree->vertical[BLOCK_8X8 < bsize],best_rd_02);
        if (local_1c0.dist == 0x7fffffffffffffff || local_1c0.rate == 0x7fffffff) {
          local_260.sse = 0x7fffffffffffffff;
          local_260.skip_txfm = '\0';
          local_260.rate = 0;
          local_260.zero_rate = 0;
          iVar13 = 0x7fffffff;
          local_260.dist = 0x7fffffffffffffff;
          local_260.rdcost = 0x7fffffffffffffff;
        }
        else {
          iVar13 = local_1c0.rate + local_260.rate;
          local_260.dist = local_1c0.dist + local_260.dist;
          local_260.rdcost = local_260.rdcost + local_1c0.rdcost;
        }
        local_260.rate = iVar13;
      }
      break;
    case 3:
      if (!bVar24) goto LAB_001e74d3;
      local_260._0_8_ = local_260._0_8_ & 0xffffffff00000000;
      local_260.dist = 0;
      local_260.rdcost = 0;
      uVar14 = 0;
      do {
        uVar18 = 0;
        if ((uVar14 & 1) != 0) {
          uVar18 = (uint)bVar8;
        }
        iVar13 = ((uint)(uVar14 >> 1) & 0x7fffffff) * (uint)bVar8;
        iVar21 = iVar13 + mi_row;
        if ((iVar21 < (cpi->common).mi_params.mi_rows) &&
           ((int)(mi_col + uVar18) < (cpi->common).mi_params.mi_cols)) {
          local_1c0._0_8_ = local_1c0._0_8_ & 0xffffffff00000000;
          local_1c0.dist = 0;
          local_1c0.rdcost = 0;
          local_1c0.sse = 0;
          in_stack_fffffffffffffd20 = &local_1c0.dist;
          av1_rd_use_partition
                    (cpi,td,tile_data,
                     mib + (long)iVar13 * (long)(cpi->common).mi_params.mi_stride + (ulong)uVar18,
                     tp_00,iVar21,mi_col + uVar18,BVar12,&local_1c0.rate,&local_1c0.dist,
                     (uint)(uVar14 != 3),pc_tree->split[uVar14]);
          if ((local_1c0.rate == 0x7fffffff) || (local_1c0.dist == 0x7fffffffffffffff)) {
            local_260.rate = 0x7fffffff;
            local_260.zero_rate = 0;
            local_260.dist = 0x7fffffffffffffff;
            local_260.rdcost = 0x7fffffffffffffff;
            local_260.sse = 0x7fffffffffffffff;
            local_260.skip_txfm = '\0';
            break;
          }
          local_260.rate = local_260.rate + local_1c0.rate;
          local_260.dist = local_260.dist + local_1c0.dist;
        }
        uVar14 = uVar14 + 1;
      } while (uVar14 != 4);
    }
  }
LAB_001e7515:
  if (local_260.rate != 0x7fffffff) {
    lVar22 = (long)local_260.rate + (long)local_1f8->partition_cost[local_228][bVar11];
    local_260.rate = (int)lVar22;
    local_260.rdcost = local_260.dist * 0x80 + ((td->mb).rdmult * lVar22 + 0x100 >> 9);
  }
  lVar22 = 0x7fffffff;
  if (((((cpi->sf).part_sf.partition_search_type == '\x02') && (BLOCK_8X8 < bsize)) && (bVar11 != 3)
      ) && (((2 < (cpi->sf).part_sf.adjust_var_based_rd_partitioning &&
             (iVar13 = (cpi->common).mi_params.mi_rows,
             (uint)bVar8 + mi_row == iVar13 || (int)local_238 + mi_row < iVar13)) &&
            (iVar13 = (cpi->common).mi_params.mi_cols,
            (uint)bVar8 + mi_col == iVar13 || (int)local_238 + mi_col < iVar13)))) {
    BVar12 = get_partition_subsize(bsize,'\x03');
    av1_restore_context(&td->mb,&local_180,mi_row,mi_col,bsize,iVar20);
    pc_tree->partitioning = '\x03';
    local_190 = &td->shared_coeff_buf;
    local_198 = local_228 * 5;
    local_188 = local_1f8->partition_cost + local_228;
    local_238 = CONCAT44(local_238._4_4_,(uint)BVar12);
    uVar14 = 0;
    iVar13 = 0;
    lVar19 = 0;
    do {
      iVar21 = ((uint)(uVar14 >> 1) & 0x7fffffff) * (uint)bVar8 + mi_row;
      if (iVar21 < (cpi->common).mi_params.mi_rows) {
        uVar18 = 0;
        if ((uVar14 & 1) != 0) {
          uVar18 = (uint)bVar8;
        }
        mi_col_00 = uVar18 + mi_col;
        local_228 = lVar19;
        if (mi_col_00 < (cpi->common).mi_params.mi_cols) {
          av1_save_context(&td->mb,&local_180,mi_row,mi_col,bsize,iVar20);
          pPVar16 = pc_tree->split[uVar14];
          pPVar16->partitioning = '\0';
          pPVar15 = pPVar16->none;
          if (pPVar15 == (PICK_MODE_CONTEXT *)0x0) {
            pPVar15 = av1_alloc_pmc(cpi,(BLOCK_SIZE)local_238,local_190);
            pc_tree->split[uVar14]->none = pPVar15;
            pPVar15 = pc_tree->split[uVar14]->none;
            if (pPVar15 == (PICK_MODE_CONTEXT *)0x0) {
              aom_internal_error((td->mb).e_mbd.error_info,AOM_CODEC_MEM_ERROR,
                                 "Failed to allocate PICK_MODE_CONTEXT");
              pPVar15 = pc_tree->split[uVar14]->none;
            }
          }
          best_rd_05._33_7_ = uStack_1ff;
          best_rd_05.skip_txfm = local_200;
          best_rd_05.dist._0_4_ = (int)uStack_218;
          best_rd_05._0_8_ = local_220;
          best_rd_05.dist._4_4_ = (int)((ulong)uStack_218 >> 0x20);
          best_rd_05.rdcost = local_210;
          best_rd_05.sse = uStack_208;
          in_stack_fffffffffffffd20 = local_220;
          pick_sb_modes(cpi,tile_data,&td->mb,iVar21,mi_col_00,&local_1c0,'\x03',
                        (BLOCK_SIZE)local_238,pPVar15,best_rd_05);
          av1_restore_context(&td->mb,&local_180,mi_row,mi_col,bsize,iVar20);
          iVar10 = local_1c0.dist;
          iVar9 = local_1c0.rate;
          if ((local_1c0.rate == 0x7fffffff) || (local_1c0.dist == 0x7fffffffffffffff)) {
            lVar19 = 0x7fffffffffffffff;
            tp_00 = local_230;
            goto LAB_001e7bf3;
          }
          if (uVar14 != 3) {
            encode_sb(cpi,td,tile_data,local_230,iVar21,mi_col_00,'\0',(BLOCK_SIZE)local_238,
                      pc_tree->split[uVar14],(int *)in_stack_fffffffffffffd20);
          }
          lVar19 = local_228 + iVar10;
          iVar13 = iVar9 + iVar13 + (*local_188)[0];
          tp_00 = local_230;
        }
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 != 4);
    if (iVar13 == 0x7fffffff) {
LAB_001e7bf3:
      lVar17 = 0x7fffffffffffffff;
      lVar22 = 0x7fffffff;
    }
    else {
      lVar22 = (long)iVar13 + (long)local_1f8->partition_cost[0][local_198 * 2 + 3];
      lVar17 = lVar19 * 0x80 + ((td->mb).rdmult * lVar22 + 0x100 >> 9);
    }
  }
  else {
    lVar17 = 0x7fffffffffffffff;
    lVar19 = 0x7fffffffffffffff;
  }
  iVar13 = (int)lVar22;
  if (local_260.rdcost < lVar17) {
    (*mib)->bsize = BVar3;
    if (BLOCK_8X4 < bsize) {
      pc_tree->partitioning = bVar11;
    }
    lVar17 = local_260.rdcost;
    lVar19 = local_260.dist;
    iVar13 = local_260.rate;
  }
  if (((local_1e8.rdcost != 0x7fffffffffffffff) &&
      (local_1e8.rdcost - (local_1e8.rdcost >> 9) < lVar17)) &&
     ((*mib)->bsize = bsize, lVar19 = local_1e8.dist, iVar13 = local_1e8.rate, BLOCK_8X4 < bsize)) {
    pc_tree->partitioning = '\0';
  }
  av1_restore_context(&td->mb,&local_180,mi_row,mi_col,bsize,iVar20);
  if (do_recon != 0) {
    bVar24 = ((cpi->common).seq_params)->sb_size != bsize;
    if (!bVar24) {
      (td->mb).cb_offset[0] = 0;
      (td->mb).cb_offset[1] = 0;
    }
    encode_sb(cpi,td,tile_data,tp_00,mi_row,mi_col,bVar24,bsize,pc_tree,
              (int *)in_stack_fffffffffffffd20);
  }
  *rate = iVar13;
  *dist = lVar19;
  (td->mb).rdmult = local_1ec;
  return;
}

Assistant:

void av1_rd_use_partition(AV1_COMP *cpi, ThreadData *td, TileDataEnc *tile_data,
                          MB_MODE_INFO **mib, TokenExtra **tp, int mi_row,
                          int mi_col, BLOCK_SIZE bsize, int *rate,
                          int64_t *dist, int do_recon, PC_TREE *pc_tree) {
  AV1_COMMON *const cm = &cpi->common;
  const CommonModeInfoParams *const mi_params = &cm->mi_params;
  const int num_planes = av1_num_planes(cm);
  TileInfo *const tile_info = &tile_data->tile_info;
  MACROBLOCK *const x = &td->mb;
  MACROBLOCKD *const xd = &x->e_mbd;
  const ModeCosts *mode_costs = &x->mode_costs;
  const int bs = mi_size_wide[bsize];
  const int hbs = bs / 2;
  const int pl = (bsize >= BLOCK_8X8)
                     ? partition_plane_context(xd, mi_row, mi_col, bsize)
                     : 0;
  const PARTITION_TYPE partition =
      (bsize >= BLOCK_8X8) ? get_partition(cm, mi_row, mi_col, bsize)
                           : PARTITION_NONE;
  const BLOCK_SIZE subsize = get_partition_subsize(bsize, partition);
  RD_SEARCH_MACROBLOCK_CONTEXT x_ctx;
  RD_STATS last_part_rdc, none_rdc, chosen_rdc, invalid_rdc;
  BLOCK_SIZE bs_type = mib[0]->bsize;
  int use_partition_none = 0;
  x->try_merge_partition = 0;

  if (pc_tree->none == NULL) {
    pc_tree->none = av1_alloc_pmc(cpi, bsize, &td->shared_coeff_buf);
    if (!pc_tree->none)
      aom_internal_error(xd->error_info, AOM_CODEC_MEM_ERROR,
                         "Failed to allocate PICK_MODE_CONTEXT");
  }
  PICK_MODE_CONTEXT *ctx_none = pc_tree->none;

  if (mi_row >= mi_params->mi_rows || mi_col >= mi_params->mi_cols) return;

  assert(mi_size_wide[bsize] == mi_size_high[bsize]);
  // In rt mode, currently the min partition size is BLOCK_8X8.
  assert(bsize >= cpi->sf.part_sf.default_min_partition_size);

  av1_invalid_rd_stats(&last_part_rdc);
  av1_invalid_rd_stats(&none_rdc);
  av1_invalid_rd_stats(&chosen_rdc);
  av1_invalid_rd_stats(&invalid_rdc);

  pc_tree->partitioning = partition;

  xd->above_txfm_context =
      cm->above_contexts.txfm[tile_info->tile_row] + mi_col;
  xd->left_txfm_context =
      xd->left_txfm_context_buffer + (mi_row & MAX_MIB_MASK);
  av1_save_context(x, &x_ctx, mi_row, mi_col, bsize, num_planes);

  if (bsize == BLOCK_16X16 && cpi->vaq_refresh) {
    av1_set_offsets(cpi, tile_info, x, mi_row, mi_col, bsize);
    x->mb_energy = av1_log_block_var(cpi, x, bsize);
  }

  // Save rdmult before it might be changed, so it can be restored later.
  const int orig_rdmult = x->rdmult;
  setup_block_rdmult(cpi, x, mi_row, mi_col, bsize, NO_AQ, NULL);

  if (partition != PARTITION_NONE &&
      is_adjust_var_based_part_enabled(cm, &cpi->sf.part_sf, bsize) &&
      (mi_row + hbs < mi_params->mi_rows &&
       mi_col + hbs < mi_params->mi_cols)) {
    assert(bsize > cpi->sf.part_sf.default_min_partition_size);
    mib[0]->bsize = bsize;
    pc_tree->partitioning = PARTITION_NONE;
    x->try_merge_partition = 1;
    pick_sb_modes(cpi, tile_data, x, mi_row, mi_col, &none_rdc, PARTITION_NONE,
                  bsize, ctx_none, invalid_rdc);

    if (none_rdc.rate < INT_MAX) {
      none_rdc.rate += mode_costs->partition_cost[pl][PARTITION_NONE];
      none_rdc.rdcost = RDCOST(x->rdmult, none_rdc.rate, none_rdc.dist);
    }

    // Try to skip split partition evaluation based on none partition
    // characteristics.
    if (none_rdc.rate < INT_MAX && none_rdc.skip_txfm == 1) {
      use_partition_none = 1;
    }

    av1_restore_context(x, &x_ctx, mi_row, mi_col, bsize, num_planes);
    mib[0]->bsize = bs_type;
    pc_tree->partitioning = partition;
  }

  for (int i = 0; i < SUB_PARTITIONS_SPLIT; ++i) {
    pc_tree->split[i] = av1_alloc_pc_tree_node(subsize);
    if (!pc_tree->split[i])
      aom_internal_error(xd->error_info, AOM_CODEC_MEM_ERROR,
                         "Failed to allocate PC_TREE");
    pc_tree->split[i]->index = i;
  }
  switch (partition) {
    case PARTITION_NONE:
      pick_sb_modes(cpi, tile_data, x, mi_row, mi_col, &last_part_rdc,
                    PARTITION_NONE, bsize, ctx_none, invalid_rdc);
      break;
    case PARTITION_HORZ:
      if (use_partition_none) {
        av1_invalid_rd_stats(&last_part_rdc);
        break;
      }

      for (int i = 0; i < SUB_PARTITIONS_RECT; ++i) {
        pc_tree->horizontal[i] =
            av1_alloc_pmc(cpi, subsize, &td->shared_coeff_buf);
        if (!pc_tree->horizontal[i])
          aom_internal_error(xd->error_info, AOM_CODEC_MEM_ERROR,
                             "Failed to allocate PICK_MODE_CONTEXT");
      }
      pick_sb_modes(cpi, tile_data, x, mi_row, mi_col, &last_part_rdc,
                    PARTITION_HORZ, subsize, pc_tree->horizontal[0],
                    invalid_rdc);
      if (last_part_rdc.rate != INT_MAX && bsize >= BLOCK_8X8 &&
          mi_row + hbs < mi_params->mi_rows) {
        RD_STATS tmp_rdc;
        const PICK_MODE_CONTEXT *const ctx_h = pc_tree->horizontal[0];
        av1_init_rd_stats(&tmp_rdc);
        av1_update_state(cpi, td, ctx_h, mi_row, mi_col, subsize, 1);
        encode_superblock(cpi, tile_data, td, tp, DRY_RUN_NORMAL, subsize,
                          NULL);
        pick_sb_modes(cpi, tile_data, x, mi_row + hbs, mi_col, &tmp_rdc,
                      PARTITION_HORZ, subsize, pc_tree->horizontal[1],
                      invalid_rdc);
        if (tmp_rdc.rate == INT_MAX || tmp_rdc.dist == INT64_MAX) {
          av1_invalid_rd_stats(&last_part_rdc);
          break;
        }
        last_part_rdc.rate += tmp_rdc.rate;
        last_part_rdc.dist += tmp_rdc.dist;
        last_part_rdc.rdcost += tmp_rdc.rdcost;
      }
      break;
    case PARTITION_VERT:
      if (use_partition_none) {
        av1_invalid_rd_stats(&last_part_rdc);
        break;
      }

      for (int i = 0; i < SUB_PARTITIONS_RECT; ++i) {
        pc_tree->vertical[i] =
            av1_alloc_pmc(cpi, subsize, &td->shared_coeff_buf);
        if (!pc_tree->vertical[i])
          aom_internal_error(xd->error_info, AOM_CODEC_MEM_ERROR,
                             "Failed to allocate PICK_MODE_CONTEXT");
      }
      pick_sb_modes(cpi, tile_data, x, mi_row, mi_col, &last_part_rdc,
                    PARTITION_VERT, subsize, pc_tree->vertical[0], invalid_rdc);
      if (last_part_rdc.rate != INT_MAX && bsize >= BLOCK_8X8 &&
          mi_col + hbs < mi_params->mi_cols) {
        RD_STATS tmp_rdc;
        const PICK_MODE_CONTEXT *const ctx_v = pc_tree->vertical[0];
        av1_init_rd_stats(&tmp_rdc);
        av1_update_state(cpi, td, ctx_v, mi_row, mi_col, subsize, 1);
        encode_superblock(cpi, tile_data, td, tp, DRY_RUN_NORMAL, subsize,
                          NULL);
        pick_sb_modes(cpi, tile_data, x, mi_row, mi_col + hbs, &tmp_rdc,
                      PARTITION_VERT, subsize,
                      pc_tree->vertical[bsize > BLOCK_8X8], invalid_rdc);
        if (tmp_rdc.rate == INT_MAX || tmp_rdc.dist == INT64_MAX) {
          av1_invalid_rd_stats(&last_part_rdc);
          break;
        }
        last_part_rdc.rate += tmp_rdc.rate;
        last_part_rdc.dist += tmp_rdc.dist;
        last_part_rdc.rdcost += tmp_rdc.rdcost;
      }
      break;
    case PARTITION_SPLIT:
      if (use_partition_none) {
        av1_invalid_rd_stats(&last_part_rdc);
        break;
      }

      last_part_rdc.rate = 0;
      last_part_rdc.dist = 0;
      last_part_rdc.rdcost = 0;
      for (int i = 0; i < SUB_PARTITIONS_SPLIT; i++) {
        int x_idx = (i & 1) * hbs;
        int y_idx = (i >> 1) * hbs;
        int jj = i >> 1, ii = i & 0x01;
        RD_STATS tmp_rdc;
        if ((mi_row + y_idx >= mi_params->mi_rows) ||
            (mi_col + x_idx >= mi_params->mi_cols))
          continue;

        av1_init_rd_stats(&tmp_rdc);
        av1_rd_use_partition(
            cpi, td, tile_data,
            mib + jj * hbs * mi_params->mi_stride + ii * hbs, tp,
            mi_row + y_idx, mi_col + x_idx, subsize, &tmp_rdc.rate,
            &tmp_rdc.dist, i != (SUB_PARTITIONS_SPLIT - 1), pc_tree->split[i]);
        if (tmp_rdc.rate == INT_MAX || tmp_rdc.dist == INT64_MAX) {
          av1_invalid_rd_stats(&last_part_rdc);
          break;
        }
        last_part_rdc.rate += tmp_rdc.rate;
        last_part_rdc.dist += tmp_rdc.dist;
      }
      break;
    case PARTITION_VERT_A:
    case PARTITION_VERT_B:
    case PARTITION_HORZ_A:
    case PARTITION_HORZ_B:
    case PARTITION_HORZ_4:
    case PARTITION_VERT_4:
      assert(0 && "Cannot handle extended partition types");
    default: assert(0); break;
  }

  if (last_part_rdc.rate < INT_MAX) {
    last_part_rdc.rate += mode_costs->partition_cost[pl][partition];
    last_part_rdc.rdcost =
        RDCOST(x->rdmult, last_part_rdc.rate, last_part_rdc.dist);
  }

  if ((cpi->sf.part_sf.partition_search_type == VAR_BASED_PARTITION &&
       cpi->sf.part_sf.adjust_var_based_rd_partitioning > 2) &&
      partition != PARTITION_SPLIT && bsize > BLOCK_8X8 &&
      (mi_row + bs < mi_params->mi_rows ||
       mi_row + hbs == mi_params->mi_rows) &&
      (mi_col + bs < mi_params->mi_cols ||
       mi_col + hbs == mi_params->mi_cols)) {
    BLOCK_SIZE split_subsize = get_partition_subsize(bsize, PARTITION_SPLIT);
    chosen_rdc.rate = 0;
    chosen_rdc.dist = 0;

    av1_restore_context(x, &x_ctx, mi_row, mi_col, bsize, num_planes);
    pc_tree->partitioning = PARTITION_SPLIT;

    // Split partition.
    for (int i = 0; i < SUB_PARTITIONS_SPLIT; i++) {
      int x_idx = (i & 1) * hbs;
      int y_idx = (i >> 1) * hbs;
      RD_STATS tmp_rdc;

      if ((mi_row + y_idx >= mi_params->mi_rows) ||
          (mi_col + x_idx >= mi_params->mi_cols))
        continue;

      av1_save_context(x, &x_ctx, mi_row, mi_col, bsize, num_planes);
      pc_tree->split[i]->partitioning = PARTITION_NONE;
      if (pc_tree->split[i]->none == NULL)
        pc_tree->split[i]->none =
            av1_alloc_pmc(cpi, split_subsize, &td->shared_coeff_buf);
      if (!pc_tree->split[i]->none)
        aom_internal_error(xd->error_info, AOM_CODEC_MEM_ERROR,
                           "Failed to allocate PICK_MODE_CONTEXT");
      pick_sb_modes(cpi, tile_data, x, mi_row + y_idx, mi_col + x_idx, &tmp_rdc,
                    PARTITION_SPLIT, split_subsize, pc_tree->split[i]->none,
                    invalid_rdc);

      av1_restore_context(x, &x_ctx, mi_row, mi_col, bsize, num_planes);
      if (tmp_rdc.rate == INT_MAX || tmp_rdc.dist == INT64_MAX) {
        av1_invalid_rd_stats(&chosen_rdc);
        break;
      }

      chosen_rdc.rate += tmp_rdc.rate;
      chosen_rdc.dist += tmp_rdc.dist;

      if (i != SUB_PARTITIONS_SPLIT - 1)
        encode_sb(cpi, td, tile_data, tp, mi_row + y_idx, mi_col + x_idx,
                  OUTPUT_ENABLED, split_subsize, pc_tree->split[i], NULL);

      chosen_rdc.rate += mode_costs->partition_cost[pl][PARTITION_NONE];
    }
    if (chosen_rdc.rate < INT_MAX) {
      chosen_rdc.rate += mode_costs->partition_cost[pl][PARTITION_SPLIT];
      chosen_rdc.rdcost = RDCOST(x->rdmult, chosen_rdc.rate, chosen_rdc.dist);
    }
  }

  // If last_part is better set the partitioning to that.
  if (last_part_rdc.rdcost < chosen_rdc.rdcost) {
    mib[0]->bsize = bs_type;
    if (bsize >= BLOCK_8X8) pc_tree->partitioning = partition;

    chosen_rdc = last_part_rdc;
  }
  // If none was better set the partitioning to that.
  if (none_rdc.rdcost < INT64_MAX &&
      none_rdc.rdcost - (none_rdc.rdcost >> 9) < chosen_rdc.rdcost) {
    mib[0]->bsize = bsize;
    if (bsize >= BLOCK_8X8) pc_tree->partitioning = PARTITION_NONE;
    chosen_rdc = none_rdc;
  }

  av1_restore_context(x, &x_ctx, mi_row, mi_col, bsize, num_planes);

  // We must have chosen a partitioning and encoding or we'll fail later on.
  // No other opportunities for success.
  if (bsize == cm->seq_params->sb_size)
    assert(chosen_rdc.rate < INT_MAX && chosen_rdc.dist < INT64_MAX);

#if CONFIG_COLLECT_COMPONENT_TIMING
  start_timing(cpi, encode_sb_time);
#endif
  if (do_recon) {
    if (bsize == cm->seq_params->sb_size) {
      // NOTE: To get estimate for rate due to the tokens, use:
      // int rate_coeffs = 0;
      // encode_sb(cpi, td, tile_data, tp, mi_row, mi_col, DRY_RUN_COSTCOEFFS,
      //           bsize, pc_tree, &rate_coeffs);
      set_cb_offsets(x->cb_offset, 0, 0);
      encode_sb(cpi, td, tile_data, tp, mi_row, mi_col, OUTPUT_ENABLED, bsize,
                pc_tree, NULL);
    } else {
      encode_sb(cpi, td, tile_data, tp, mi_row, mi_col, DRY_RUN_NORMAL, bsize,
                pc_tree, NULL);
    }
  }
#if CONFIG_COLLECT_COMPONENT_TIMING
  end_timing(cpi, encode_sb_time);
#endif

  *rate = chosen_rdc.rate;
  *dist = chosen_rdc.dist;
  x->rdmult = orig_rdmult;
}